

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O0

void __thiscall Clasp::mt::ParallelSolve::SharedData::updateSplitFlag(SharedData *this)

{
  bool bVar1;
  __int_type_conflict _Var2;
  uint uVar3;
  uint *puVar4;
  long in_RDI;
  bool splitF;
  uint uStack_dc;
  __atomic_base<int> *in_stack_ffffffffffffff28;
  uint uStack_8c;
  
  while( true ) {
    _Var2 = std::__atomic_base::operator_cast_to_int(in_stack_ffffffffffffff28);
    bVar1 = split((SharedData *)0x21b23f);
    if (bVar1 == 0 < _Var2) break;
    if (0 < _Var2) {
      puVar4 = (uint *)(in_RDI + 0x154);
      uStack_8c = *puVar4;
      do {
        LOCK();
        uVar3 = *puVar4;
        bVar1 = uStack_8c == uVar3;
        if (bVar1) {
          *puVar4 = uStack_8c | 4;
          uVar3 = uStack_8c;
        }
        UNLOCK();
        uStack_8c = uVar3;
      } while (!bVar1);
    }
    else {
      puVar4 = (uint *)(in_RDI + 0x154);
      uStack_dc = *puVar4;
      do {
        LOCK();
        uVar3 = *puVar4;
        bVar1 = uStack_dc == uVar3;
        if (bVar1) {
          *puVar4 = uStack_dc & 0xfffffffb;
          uVar3 = uStack_dc;
        }
        UNLOCK();
        uStack_dc = uVar3;
      } while (!bVar1);
    }
  }
  return;
}

Assistant:

void ParallelSolve::SharedData::updateSplitFlag() {
	for (bool splitF;;) {
		splitF = (workReq > 0);
		if (split() == splitF) return;
		if (splitF) control.fetch_or(uint32(split_flag));
		else        control.fetch_and(~uint32(split_flag));
	}
}